

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O2

bool __thiscall
cmMacroHelperCommand::InvokeInitialPass
          (cmMacroHelperCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *inStatus)

{
  pointer pbVar1;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  long lVar5;
  pointer pcVar6;
  byte bVar7;
  uint uVar8;
  pointer pcVar9;
  ulong uVar10;
  uint j;
  pointer pcVar11;
  allocator<char> local_3b9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expandedArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  variables;
  MacroPushPop macroScope;
  cmExecutionStatus status;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  Delimiter local_330;
  long local_328;
  undefined4 local_320;
  undefined4 uStack_31c;
  undefined4 uStack_318;
  undefined4 uStack_314;
  long local_310;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argVs;
  string local_2e8;
  string expandedArgv;
  string expandedArgn;
  string argcDef;
  cmListFileFunction newLFF;
  ostringstream argcDefStream;
  char argvName [60];
  
  expandedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expandedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  expandedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::ExpandArguments((this->super_cmCommand).Makefile,args,&expandedArgs,(char *)0x0);
  if ((ulong)((long)expandedArgs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)expandedArgs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) <
      ((long)(this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&argcDefStream,"Macro invoked with incorrect arguments for macro named: ",
               (allocator<char> *)&newLFF);
    std::__cxx11::string::append((string *)&argcDefStream);
    cmCommand::SetError(&this->super_cmCommand,(string *)&argcDefStream);
    std::__cxx11::string::~string((string *)&argcDefStream);
    bVar7 = 0;
  }
  else {
    cmMakefile::MacroPushPop::MacroPushPop
              (&macroScope,(this->super_cmCommand).Makefile,&this->FilePath,&this->Policies);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&argcDefStream);
    std::ostream::_M_insert<unsigned_long>((ulong)&argcDefStream);
    std::__cxx11::stringbuf::str();
    newLFF.super_cmCommandContext.Name.Lower._M_dataplus._M_p =
         (pointer)((long)expandedArgs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)(this->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish +
                  (-0x20 - (long)(this->Args).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start));
    newLFF.super_cmCommandContext.Name.Lower._M_string_length =
         (size_type)
         expandedArgs.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&expandedArgn,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&newLFF,";");
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&expandedArgv,&expandedArgs,";");
    variables.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    variables.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    variables.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&variables,
              ((long)(this->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) - 1);
    for (uVar10 = 1;
        pbVar1 = (this->Args).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar10 < (ulong)((long)(this->Args).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
        uVar10 = (ulong)((int)uVar10 + 1)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&status,
                     "${",pbVar1 + uVar10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newLFF,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&status,
                     "}");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&variables,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newLFF);
      std::__cxx11::string::~string((string *)&newLFF);
      std::__cxx11::string::~string((string *)&status);
    }
    argVs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    argVs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    argVs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&argVs,(long)expandedArgs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)expandedArgs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5);
    uVar10 = 0;
    while( true ) {
      if ((ulong)((long)expandedArgs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)expandedArgs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar10) break;
      sprintf(argvName,"${ARGV%u}",uVar10);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char(&)[60]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&argVs,
                 &argvName);
      uVar10 = (ulong)((int)uVar10 + 1);
    }
    newLFF.super_cmCommandContext.Name.Lower._M_dataplus._M_p =
         (pointer)&newLFF.super_cmCommandContext.Name.Lower.field_2;
    newLFF.super_cmCommandContext.Name.Lower._M_string_length = 0;
    newLFF.super_cmCommandContext.Name.Lower.field_2._M_local_buf[0] = '\0';
    newLFF.super_cmCommandContext.Name.Original._M_dataplus._M_p =
         (pointer)&newLFF.super_cmCommandContext.Name.Original.field_2;
    newLFF.super_cmCommandContext.Name.Original._M_string_length = 0;
    newLFF.super_cmCommandContext.Name.Original.field_2._M_local_buf[0] = '\0';
    newLFF.super_cmCommandContext.Line = 0;
    newLFF.super_cmCommandContext.Col = 0;
    newLFF.super_cmCommandContext.EndLine = 0;
    newLFF.super_cmCommandContext.EndCol = 0;
    newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar9 = (this->Functions).
             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = (this->Functions).
             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar6 = pcVar2;
    while( true ) {
      bVar7 = (byte)pcVar6;
      if (pcVar9 == pcVar2) break;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::clear(&newLFF.Arguments)
      ;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::reserve
                (&newLFF.Arguments,
                 ((long)(pcVar9->Arguments).
                        super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pcVar9->Arguments).
                       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                       _M_impl.super__Vector_impl_data._M_start) / 0x48);
      cmCommandContext::cmCommandName::operator=((cmCommandName *)&newLFF,(cmCommandName *)pcVar9);
      newLFF.super_cmCommandContext.Line = (pcVar9->super_cmCommandContext).Line;
      pcVar3 = (pcVar9->Arguments).
               super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pcVar11 = (pcVar9->Arguments).
                     super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                     _M_impl.super__Vector_impl_data._M_start; pcVar11 != pcVar3;
          pcVar11 = pcVar11 + 1) {
        local_340._M_local_buf[0] = '\0';
        local_330 = Unquoted;
        local_328 = 0;
        local_320 = 0xffffffff;
        uStack_31c = 0xffffffff;
        uStack_318 = 0xffffffff;
        uStack_314 = 0xffffffff;
        local_310 = -1;
        _status = (pointer)&local_340;
        std::__cxx11::string::_M_assign((string *)&status);
        if (pcVar11->Delim != Bracket) {
          uVar8 = 0;
          while( true ) {
            uVar10 = (ulong)uVar8;
            if ((ulong)((long)variables.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)variables.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar10) break;
            cmsys::SystemTools::ReplaceString
                      ((string *)&status,
                       variables.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar10,
                       expandedArgs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar10);
            uVar8 = uVar8 + 1;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2e8,"${ARGC}",&local_3b9);
          cmsys::SystemTools::ReplaceString((string *)&status,&local_2e8,&argcDef);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2e8,"${ARGN}",&local_3b9);
          cmsys::SystemTools::ReplaceString((string *)&status,&local_2e8,&expandedArgn);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2e8,"${ARGV}",&local_3b9);
          cmsys::SystemTools::ReplaceString((string *)&status,&local_2e8,&expandedArgv);
          std::__cxx11::string::~string((string *)&local_2e8);
          lVar5 = std::__cxx11::string::find((char *)&status,0x4bbbbb);
          if (lVar5 != -1) {
            uVar8 = 0;
            while( true ) {
              uVar10 = (ulong)uVar8;
              if ((ulong)((long)expandedArgs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)expandedArgs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar10) break;
              cmsys::SystemTools::ReplaceString
                        ((string *)&status,
                         argVs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar10,
                         expandedArgs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar10);
              uVar8 = uVar8 + 1;
            }
          }
        }
        local_330 = pcVar11->Delim;
        local_328 = pcVar11->Line;
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
        emplace_back<cmListFileArgument>(&newLFF.Arguments,(cmListFileArgument *)&status);
        std::__cxx11::string::~string((string *)&status);
      }
      _status = _status & 0xffffffff00000000;
      bVar4 = cmMakefile::ExecuteCommand((this->super_cmCommand).Makefile,&newLFF,&status);
      if ((!bVar4) || (status.NestedError == true)) {
        macroScope.ReportError = false;
        inStatus = (cmExecutionStatus *)&inStatus->NestedError;
        bVar7 = 0;
LAB_00278e8f:
        inStatus->ReturnInvoked = true;
        break;
      }
      pcVar6 = (pointer)0x1;
      bVar7 = 1;
      if (status.ReturnInvoked != false) goto LAB_00278e8f;
      if (status.BreakInvoked == true) {
        inStatus = (cmExecutionStatus *)&inStatus->BreakInvoked;
        goto LAB_00278e8f;
      }
      pcVar9 = pcVar9 + 1;
    }
    bVar7 = pcVar9 == pcVar2 | bVar7;
    cmListFileFunction::~cmListFileFunction(&newLFF);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&argVs);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&variables);
    std::__cxx11::string::~string((string *)&expandedArgv);
    std::__cxx11::string::~string((string *)&expandedArgn);
    std::__cxx11::string::~string((string *)&argcDef);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&argcDefStream);
    cmMakefile::MacroPushPop::~MacroPushPop(&macroScope);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expandedArgs);
  return (bool)(bVar7 & 1);
}

Assistant:

bool cmMacroHelperCommand::InvokeInitialPass(
  const std::vector<cmListFileArgument>& args, cmExecutionStatus& inStatus)
{
  // Expand the argument list to the macro.
  std::vector<std::string> expandedArgs;
  this->Makefile->ExpandArguments(args, expandedArgs);

  // make sure the number of arguments passed is at least the number
  // required by the signature
  if (expandedArgs.size() < this->Args.size() - 1) {
    std::string errorMsg =
      "Macro invoked with incorrect arguments for macro named: ";
    errorMsg += this->Args[0];
    this->SetError(errorMsg);
    return false;
  }

  cmMakefile::MacroPushPop macroScope(this->Makefile, this->FilePath,
                                      this->Policies);

  // set the value of argc
  std::ostringstream argcDefStream;
  argcDefStream << expandedArgs.size();
  std::string argcDef = argcDefStream.str();

  std::vector<std::string>::const_iterator eit =
    expandedArgs.begin() + (this->Args.size() - 1);
  std::string expandedArgn = cmJoin(cmMakeRange(eit, expandedArgs.end()), ";");
  std::string expandedArgv = cmJoin(expandedArgs, ";");
  std::vector<std::string> variables;
  variables.reserve(this->Args.size() - 1);
  for (unsigned int j = 1; j < this->Args.size(); ++j) {
    variables.push_back("${" + this->Args[j] + "}");
  }
  std::vector<std::string> argVs;
  argVs.reserve(expandedArgs.size());
  char argvName[60];
  for (unsigned int j = 0; j < expandedArgs.size(); ++j) {
    sprintf(argvName, "${ARGV%u}", j);
    argVs.emplace_back(argvName);
  }
  // Invoke all the functions that were collected in the block.
  cmListFileFunction newLFF;
  // for each function
  for (cmListFileFunction const& func : this->Functions) {
    // Replace the formal arguments and then invoke the command.
    newLFF.Arguments.clear();
    newLFF.Arguments.reserve(func.Arguments.size());
    newLFF.Name = func.Name;
    newLFF.Line = func.Line;

    // for each argument of the current function
    for (cmListFileArgument const& k : func.Arguments) {
      cmListFileArgument arg;
      arg.Value = k.Value;
      if (k.Delim != cmListFileArgument::Bracket) {
        // replace formal arguments
        for (unsigned int j = 0; j < variables.size(); ++j) {
          cmSystemTools::ReplaceString(arg.Value, variables[j],
                                       expandedArgs[j]);
        }
        // replace argc
        cmSystemTools::ReplaceString(arg.Value, "${ARGC}", argcDef);

        cmSystemTools::ReplaceString(arg.Value, "${ARGN}", expandedArgn);
        cmSystemTools::ReplaceString(arg.Value, "${ARGV}", expandedArgv);

        // if the current argument of the current function has ${ARGV in it
        // then try replacing ARGV values
        if (arg.Value.find("${ARGV") != std::string::npos) {
          for (unsigned int t = 0; t < expandedArgs.size(); ++t) {
            cmSystemTools::ReplaceString(arg.Value, argVs[t], expandedArgs[t]);
          }
        }
      }
      arg.Delim = k.Delim;
      arg.Line = k.Line;
      newLFF.Arguments.push_back(std::move(arg));
    }
    cmExecutionStatus status;
    if (!this->Makefile->ExecuteCommand(newLFF, status) ||
        status.GetNestedError()) {
      // The error message should have already included the call stack
      // so we do not need to report an error here.
      macroScope.Quiet();
      inStatus.SetNestedError();
      return false;
    }
    if (status.GetReturnInvoked()) {
      inStatus.SetReturnInvoked();
      return true;
    }
    if (status.GetBreakInvoked()) {
      inStatus.SetBreakInvoked();
      return true;
    }
  }
  return true;
}